

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O1

size_t __thiscall
Memory::SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
GetNonEmptyHeapBlockCount
          (SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,bool checkCount)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar5;
  undefined4 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  lVar7 = 0;
  sVar4 = HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
          GetNonEmptyHeapBlockCount
                    (&this->
                      super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                     ,false);
  pSVar5 = this->partialHeapBlockList;
  if (pSVar5 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar7 = 0;
    do {
      pSVar1 = (pSVar5->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
        pSVar5 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      }
      else {
        pSVar5 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock)
        ;
      }
      lVar7 = lVar7 + 1;
    } while (pSVar5 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar5 = this->partialSweptHeapBlockList;
  lVar9 = 0;
  while (pSVar5 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar5->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar5 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar5 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
    }
    lVar9 = lVar9 + 1;
  }
  uVar8 = lVar7 + sVar4 + lVar9;
  if ((checkCount) &&
     (uVar8 != (this->
               super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>).
               super_HeapBucket.heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x2d4,
                       "(!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return uVar8;
}

Assistant:

size_t
SmallNormalHeapBucketBase<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount = __super::GetNonEmptyHeapBlockCount(false);
    currentHeapBlockCount += HeapBlockList::Count(partialHeapBlockList);
#if ENABLE_CONCURRENT_GC
    currentHeapBlockCount += HeapBlockList::Count(partialSweptHeapBlockList);
#endif
    bool allocatingDuringConcurrentSweep = false;

#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
        allocatingDuringConcurrentSweep = true;
    }
#endif
#endif
#endif
    RECYCLER_SLOW_CHECK(Assert(!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)));
    return currentHeapBlockCount;
}